

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemove.cc
# Opt level: O2

bool board::makemove::move(Move *move,Board *pos)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int to;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint from;
  value_type local_48;
  
  uVar7 = move->value;
  from = uVar7 & 0x7f;
  uVar9 = uVar7 >> 7 & 0x7f;
  iVar3 = pos->side;
  local_48.fiftyMove = pos->fiftyMove;
  iVar6 = pos->board[from];
  local_48.hashKey = pos->hashKey;
  uVar1 = pos->enPas;
  uVar2 = pos->castlePerm;
  local_48.enPas = uVar1;
  local_48.castlePerm = uVar2;
  local_48.moveValue = uVar7;
  if ((uVar7 >> 0x12 & 1) == 0) {
    if ((uVar7 >> 0x18 & 1) != 0) {
      if (uVar9 == 0x61) {
        iVar8 = 0x62;
        to = 0x60;
      }
      else if (uVar9 == 0x1b) {
        iVar8 = 0x1c;
        to = 0x1a;
      }
      else if (uVar9 == 0x5d) {
        iVar8 = 0x5b;
        to = 0x5e;
      }
      else {
        if (uVar9 != 0x17) goto LAB_00129355;
        iVar8 = 0x15;
        to = 0x18;
      }
      movePiece(iVar8,to,pos);
    }
  }
  else {
    if (iVar3 == 0) {
      iVar8 = uVar9 - 10;
    }
    else {
      iVar8 = uVar9 + 10;
    }
    clearPiece(iVar8,pos);
  }
LAB_00129355:
  uVar5 = pos->hashKey;
  if ((long)pos->enPas != 99) {
    uVar5 = uVar5 ^ Board::PIECE_KEYS[0][pos->enPas];
    pos->hashKey = uVar5;
  }
  pos->hashKey = uVar5 ^ Board::CASTLE_KEYS[pos->castlePerm];
  std::vector<board::Undo,_std::allocator<board::Undo>_>::push_back(&pos->history,&local_48);
  Board::updateCastlePerm(pos,uVar9,from);
  pos->hashKey = pos->hashKey ^ Board::CASTLE_KEYS[pos->castlePerm];
  pos->enPas = 99;
  pos->fiftyMove = pos->fiftyMove + 1;
  if ((uVar7 & 0x3c000) != 0) {
    clearPiece(uVar9,pos);
    pos->fiftyMove = 0;
  }
  pos->ply = pos->ply + 1;
  uVar7 = uVar7 >> 0x14 & 0xf;
  if ((Board::PIECE_NO_TEAM[iVar6] == 1) && (pos->fiftyMove = 0, (move->value & 0x80000) != 0)) {
    iVar6 = from + 10;
    if (iVar3 != 0) {
      iVar6 = from - 10;
    }
    pos->enPas = iVar6;
    pos->hashKey = pos->hashKey ^ Board::PIECE_KEYS[0][iVar6];
  }
  movePiece(from,uVar9,pos);
  if (uVar7 != 0) {
    clearPiece(uVar9,pos);
    addPiece(uVar7,uVar9,pos);
  }
  uVar7 = pos->side;
  uVar9 = uVar7 ^ 1;
  pos->side = uVar9;
  pos->hashKey = pos->hashKey ^ Board::SIDE_KEY;
  if (uVar7 == 0) {
    bVar4 = Board::sqAttacked(pos,pos->pList[6][0],1);
    if (bVar4) goto LAB_001294d4;
    uVar9 = pos->side;
  }
  if (uVar9 != 0) {
    return true;
  }
  bVar4 = Board::sqAttacked(pos,pos->pList[0xc][0],0);
  if (!bVar4) {
    return true;
  }
LAB_001294d4:
  undo(pos);
  return false;
}

Assistant:

bool board::makemove::move(Move& move, Board& pos)
{
    int from = Move::FROMSQ(move.getValue());
    int to = Move::TOSQ(move.getValue());
    int captured = Move::CAPTURED(move.getValue());
    int promoted = Move::PROMOTED(move.getValue());
    int side = pos.getSide();
    int piece = pos.getSquare(from);
    int castle = pos.getCastlePerm();
    int enPas = pos.getEnPas();
    int fiftyMove = pos.getFiftyMove();
    uint64_t hash = pos.getHashKey();
    Undo current = Undo(castle, enPas, fiftyMove, move.getValue(), hash);
    if (move.getValue() & Move::MFLAGEP) {
        if (side == WHITE) {
            clearPiece(to - 10, pos);
        }
        else {
            clearPiece(to + 10, pos);
        }
    }
    else if (move.getValue() & Move::MFLAGCA) {
        if (to == C1) {
            movePiece(A1, D1, pos);
        }
        else if (to == C8) {
            movePiece(A8, D8, pos);
        }
        else if (to == G1) {
            movePiece(H1, F1, pos);
        }
        else if (to == G8) {
            movePiece(H8, F8, pos);
        }
    }
    if (pos.getEnPas() != NO_SQ) {
        pos.hashEnPas();
    }
    pos.hashCastle();
    pos.addHistory(current);
    pos.updateCastlePerm(to, from);
    pos.hashCastle();
    pos.clearEnPas();
    pos.incrementFiftyMove();
    if (captured != EMPTY) {
        clearPiece(to, pos);
        pos.resetFiftyMove();
    }
    pos.incrementPly();
    if (Board::PIECE_NO_TEAM[piece] == WP) {
        pos.resetFiftyMove();
        if (move.getValue() & Move::MFLAGPS) {
            if (side == WHITE) {
                pos.setEnPas(from + 10);
            }
            else {
                pos.setEnPas(from - 10);
            }
            pos.hashEnPas();
        }
    }
    movePiece(from, to, pos);
    if (promoted != EMPTY) {
        clearPiece(to, pos);
        addPiece(promoted, to, pos);
    }
    pos.updateSide();
    pos.hashSide();
    if (pos.getSide() == BLACK && pos.sqAttacked(pos.getPieceList(WK)[0], BLACK)) {
        undo(pos);
        return false;
    }
    if (pos.getSide() == WHITE && pos.sqAttacked(pos.getPieceList(BK)[0], WHITE)) {
        undo(pos);
        return false;
    }
    return true;
}